

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ColumnRef __thiscall
clickhouse::ColumnVector<unsigned_char>::Slice
          (ColumnVector<unsigned_char> *this,size_t begin,size_t len)

{
  undefined8 uVar1;
  size_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ColumnRef CVar2;
  undefined1 local_38 [40];
  
  SliceVector<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_38 + 0x10),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(begin + 0x28),len,in_RCX);
  std::
  make_shared<clickhouse::ColumnVector<unsigned_char>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  uVar1 = local_38._8_8_;
  local_38._8_8_ = (pointer)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)local_38._0_8_;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar1;
  local_38._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_38 + 0x10));
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnVector<T>::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnVector<T>>(SliceVector(data_, begin, len));
}